

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefileCall::cmMakefileCall
          (cmMakefileCall *this,cmMakefile *mf,cmCommandContext *lfc,cmExecutionStatus *status)

{
  cmCommandContext *local_20;
  
  this->Makefile = mf;
  local_20 = lfc;
  std::vector<cmCommandContext_const*,std::allocator<cmCommandContext_const*>>::
  emplace_back<cmCommandContext_const*>
            ((vector<cmCommandContext_const*,std::allocator<cmCommandContext_const*>> *)
             &mf->ContextStack,&local_20);
  local_20 = (cmCommandContext *)status;
  std::vector<cmExecutionStatus*,std::allocator<cmExecutionStatus*>>::
  emplace_back<cmExecutionStatus*>
            ((vector<cmExecutionStatus*,std::allocator<cmExecutionStatus*>> *)
             &this->Makefile->ExecutionStatusStack,(cmExecutionStatus **)&local_20);
  return;
}

Assistant:

cmMakefileCall::cmMakefileCall(cmMakefile* mf, const cmCommandContext& lfc,
                               cmExecutionStatus& status): Makefile(mf)
{
  this->Makefile->ContextStack.push_back(&lfc);
  this->Makefile->ExecutionStatusStack.push_back(&status);
}